

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelMappingSparse.cpp
# Opt level: O0

void __thiscall
ObservationModelMappingSparse::ObservationModelMappingSparse
          (ObservationModelMappingSparse *this,ObservationModelMappingSparse *OM)

{
  value_type *__x;
  value_type *ppcVar1;
  long in_RSI;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_RDI;
  uint a;
  SparseMatrix *O;
  ObservationModelDiscrete *in_stack_ffffffffffffffa8;
  ObservationModelDiscrete *in_stack_ffffffffffffffb0;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *m;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffd0;
  uint local_1c;
  
  ObservationModelDiscrete::ObservationModelDiscrete
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RDI->
  super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ObservationModelMappingSparse_00d4d050
  ;
  m = (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)(in_RDI + 1);
  std::
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::vector((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)0xb01913);
  local_1c = 0;
  while( true ) {
    __x = (value_type *)(ulong)local_1c;
    ppcVar1 = (value_type *)
              std::
              vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              ::size((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                      *)(in_RSI + 0x18));
    if (__x == ppcVar1) break;
    operator_new(0x70);
    std::
    vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::operator[]((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                  *)(in_RSI + 0x18),(ulong)local_1c);
    boost::numeric::ublas::
    compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::compressed_matrix(in_stack_ffffffffffffffd0,m);
    std::
    vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back(in_RDI,__x);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

ObservationModelMappingSparse::
ObservationModelMappingSparse(const ObservationModelMappingSparse& OM) :
    ObservationModelDiscrete(OM)
{
    SparseMatrix *O;
    for(unsigned int a=0;a!=OM._m_O.size();++a)
    {
        O=new SparseMatrix(*OM._m_O[a]);
        _m_O.push_back(O);
    }
}